

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_HistoryRecord::GetGeometryValue(ON_HistoryRecord *this,int value_id,ON_Geometry **g)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_Geometry **ppOVar3;
  ON_GeometryValue *v;
  bool rc;
  ON_Geometry **g_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  *g = (ON_Geometry *)0x0;
  pOVar2 = FindValueHelper(this,value_id,10,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<ON_Geometry_*>::Count((ON_SimpleArray<ON_Geometry_*> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      ppOVar3 = ON_SimpleArray<ON_Geometry_*>::operator[]
                          ((ON_SimpleArray<ON_Geometry_*> *)(pOVar2 + 1),0);
      *g = *ppOVar3;
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetGeometryValue( int value_id, const ON_Geometry*& g ) const
{
  bool rc = false;
  g = 0;
  const ON_GeometryValue* v = static_cast<ON_GeometryValue*>(FindValueHelper(value_id,ON_Value::geometry_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    g = v->m_value[0];
    rc = true;
  }
  return rc;
}